

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O3

void __thiscall
TimedMutexTest_TryLockUntil_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
::TestBody(TimedMutexTest_TryLockUntil_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
           *this)

{
  undefined1 *nthread;
  size_t *in_RCX;
  pointer *__ptr;
  char *message;
  anon_class_16_2_e823ffd4_for_f f;
  size_t counter;
  TypeParam mtx;
  Message local_c8;
  AssertHelper local_c0;
  internal local_b8 [8];
  undefined8 *local_b0;
  undefined1 local_a8 [24];
  undefined1 *local_90;
  condition_variable local_70 [48];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  nthread = local_a8 + 8;
  local_a8._8_8_ = 0;
  local_a8._16_8_ = nthread;
  local_90 = nthread;
  std::condition_variable::condition_variable((condition_variable *)(local_a8 + 0x38));
  local_20 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_a8._0_8_ = 0;
  f.counter = in_RCX;
  f.mtx = (TypeParam *)local_a8;
  yamc::test::
  task_runner<TimedMutexTest_TryLockUntil_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>>::TestBody()::_lambda(unsigned_long)_1_>
            ((test *)0x8,(size_t)nthread,f);
  local_c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 80000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_b8,"10000u * 8","counter",(uint *)&local_c8,(unsigned_long *)local_a8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message(&local_c8);
    if (local_b0 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x124,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((long *)CONCAT44(local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b0 != local_b0 + 2) {
      operator_delete((undefined8 *)*local_b0);
    }
    operator_delete(local_b0);
  }
  std::condition_variable::~condition_variable((condition_variable *)(local_a8 + 0x38));
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockUntil)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock_until(std::chrono::system_clock::now() + TEST_NOT_TIMEOUT)) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}